

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_StringReturnValue_Test::testBody
          (TEST_MockReturnValueTest_StringReturnValue_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  undefined8 uVar6;
  undefined4 extraout_var_01;
  SimpleString local_c8;
  MockNamedValue local_b8;
  SimpleString local_68;
  SimpleString local_58;
  long *local_48;
  MockActualCall *actual_call;
  SimpleString local_20;
  TEST_MockReturnValueTest_StringReturnValue_Test *local_10;
  TEST_MockReturnValueTest_StringReturnValue_Test *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"");
  pMVar2 = mock(&local_20,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)&actual_call,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&actual_call);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x100))
            ((long *)CONCAT44(extraout_var,iVar1),"hello world");
  SimpleString::~SimpleString((SimpleString *)&actual_call);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(&local_58,"");
  pMVar2 = mock(&local_58,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_68,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_68);
  SimpleString::~SimpleString(&local_68);
  SimpleString::~SimpleString(&local_58);
  local_48 = (long *)CONCAT44(extraout_var_00,iVar1);
  pUVar3 = UtestShell::getCurrent();
  (**(code **)(*local_48 + 0xa8))();
  pcVar4 = MockNamedValue::getStringValue(&local_b8);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,"hello world",pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x280,pTVar5);
  MockNamedValue::~MockNamedValue(&local_b8);
  pUVar3 = UtestShell::getCurrent();
  uVar6 = (**(code **)(*local_48 + 0x128))();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,"hello world",uVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x281,pTVar5);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_c8,"");
  pMVar2 = mock(&local_c8,(MockFailureReporter *)0x0);
  iVar1 = (*pMVar2->_vptr_MockSupport[0x17])();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,"hello world",CONCAT44(extraout_var_01,iVar1),0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x282,pTVar5);
  SimpleString::~SimpleString(&local_c8);
  return;
}

Assistant:

TEST(MockReturnValueTest, StringReturnValue)
{
    mock().expectOneCall("foo").andReturnValue("hello world");
    MockActualCall& actual_call = mock().actualCall("foo");

    STRCMP_EQUAL("hello world", actual_call.returnValue().getStringValue());
    STRCMP_EQUAL("hello world", actual_call.returnStringValue());
    STRCMP_EQUAL("hello world", mock().stringReturnValue());
}